

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O2

void __thiscall
duckdb::ReduceExecuteInfo::ReduceExecuteInfo
          (ReduceExecuteInfo *this,LambdaInfo *info,ClientContext *context)

{
  sel_t *psVar1;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  _Alloc_hider __p;
  bool bVar2;
  Vector *args;
  pointer pVVar3;
  reference pvVar4;
  Expression *args_1;
  ParameterNotAllowedException *this_01;
  ulong row_idx;
  ulong uVar5;
  idx_t count;
  allocator local_91;
  vector<duckdb::LogicalType,_true> *local_90;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_88;
  unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
  *local_80;
  ReduceExecuteInfo *local_78;
  string local_70;
  ClientContext *local_50;
  SelectionVector left_vector;
  
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->active_rows).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  local_50 = context;
  args = optional_ptr<duckdb::Vector,_true>::operator*(&info->child_vector);
  make_uniq<duckdb::Vector,duckdb::Vector&>((duckdb *)&this->left_slice,args);
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expr_executor).
  super_unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
  .super__Head_base<0UL,_duckdb::ExpressionExecutor_*,_false>._M_head_impl =
       (ExpressionExecutor *)0x0;
  (this->input_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->initial_value_offset = 1;
  (this->left_sel).sel_vector = (sel_t *)0x0;
  (this->left_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->left_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->active_rows_sel).sel_vector = (sel_t *)0x0;
  (this->active_rows_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->active_rows_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (info->has_initial == true) {
    this->initial_value_offset = 0;
  }
  local_80 = &this->expr_executor;
  local_90 = &this->input_types;
  SelectionVector::SelectionVector(&left_vector,info->row_count);
  local_78 = this;
  ValidityMask::Resize(&this->active_rows,info->row_count);
  TemplatedValidityMask<unsigned_long>::SetAllValid
            ((TemplatedValidityMask<unsigned_long> *)this,info->row_count);
  SelectionVector::Initialize(&this->left_sel,info->row_count);
  SelectionVector::Initialize(&this->active_rows_sel,info->row_count);
  if (info->has_initial == true) {
    *left_vector.sel_vector = 0;
  }
  count = 0;
  uVar5 = 0;
  local_88 = &this->left_slice;
  do {
    this_00 = local_88;
    if (info->row_count <= uVar5) {
      pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (local_88);
      Vector::Slice(pVVar3,&left_vector,count);
      if (info->has_index == true) {
        LogicalType::LogicalType((LogicalType *)&local_70,BIGINT);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  (&local_90->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (LogicalType *)&local_70);
        LogicalType::~LogicalType((LogicalType *)&local_70);
      }
      pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (this_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_90->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pVVar3->type);
      pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (this_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_90->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pVVar3->type);
      for (uVar5 = (ulong)info->has_initial;
          uVar5 < (ulong)(((long)(info->column_infos).
                                 super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                 .
                                 super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(info->column_infos).
                                super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                .
                                super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x68);
          uVar5 = uVar5 + 1) {
        pvVar4 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::get<true>
                           (&info->column_infos,uVar5);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_90->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &((pvVar4->vector)._M_data)->type);
      }
      args_1 = optional_ptr<duckdb::Expression,_true>::operator*(&info->lambda_expr);
      make_uniq<duckdb::ExpressionExecutor,duckdb::ClientContext&,duckdb::Expression&>
                ((duckdb *)&local_70,local_50,args_1);
      __p._M_p = local_70._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
      ::reset((__uniq_ptr_impl<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
               *)local_80,(pointer)__p._M_p);
      ::std::
      unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>::
      ~unique_ptr((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>_>
                   *)&local_70);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&left_vector.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      return;
    }
    psVar1 = ((info->list_column_format).sel)->sel_vector;
    row_idx = uVar5;
    if (psVar1 != (sel_t *)0x0) {
      row_idx = (ulong)psVar1[uVar5];
    }
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(info->list_column_format).validity.
                        super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar2) {
      if ((info->list_entries[row_idx].length == 0) && (info->has_initial == false)) {
        this_01 = (ParameterNotAllowedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Cannot perform list_reduce on an empty input list",&local_91
                  );
        ParameterNotAllowedException::ParameterNotAllowedException(this_01,&local_70);
        __cxa_throw(this_01,&ParameterNotAllowedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      left_vector.sel_vector[count] = (sel_t)info->list_entries[row_idx].offset;
      count = count + 1;
    }
    else {
      FlatVector::SetNull(info->result,uVar5,true);
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)local_78,uVar5);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

ReduceExecuteInfo(LambdaFunctions::LambdaInfo &info, ClientContext &context)
	    : left_slice(make_uniq<Vector>(*info.child_vector)) {
		if (info.has_initial) {
			initial_value_offset = 0;
		}
		SelectionVector left_vector(info.row_count);
		active_rows.Resize(info.row_count);
		active_rows.SetAllValid(info.row_count);

		left_sel.Initialize(info.row_count);
		active_rows_sel.Initialize(info.row_count);

		idx_t reduced_row_idx = 0;

		if (info.has_initial) {
			left_vector.set_index(0, 0);
		}

		for (idx_t original_row_idx = 0; original_row_idx < info.row_count; original_row_idx++) {
			auto list_column_format_index = info.list_column_format.sel->get_index(original_row_idx);
			if (info.list_column_format.validity.RowIsValid(list_column_format_index)) {
				if (info.list_entries[list_column_format_index].length == 0 && !info.has_initial) {
					throw ParameterNotAllowedException("Cannot perform list_reduce on an empty input list");
				}
				left_vector.set_index(reduced_row_idx, info.list_entries[list_column_format_index].offset);
				reduced_row_idx++;
			} else {
				// Set the row as invalid and remove it from the active rows.
				FlatVector::SetNull(info.result, original_row_idx, true);
				active_rows.SetInvalid(original_row_idx);
			}
		}
		left_slice->Slice(left_vector, reduced_row_idx);

		if (info.has_index) {
			input_types.push_back(LogicalType::BIGINT);
		}
		input_types.push_back(left_slice->GetType());
		input_types.push_back(left_slice->GetType());
		// skip the first entry if there is an initial value
		for (idx_t i = info.has_initial ? 1 : 0; i < info.column_infos.size(); i++) {
			input_types.push_back(info.column_infos[i].vector.get().GetType());
		}

		expr_executor = make_uniq<ExpressionExecutor>(context, *info.lambda_expr);
	}